

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventhandler.hpp
# Opt level: O2

void __thiscall
Eventhandler<QpModelStatus_&>::fire(Eventhandler<QpModelStatus_&> *this,QpModelStatus *args)

{
  pointer pfVar1;
  pointer __x;
  function<void_(QpModelStatus_&)> fun;
  function<void_(QpModelStatus_&)> local_40;
  
  pfVar1 = (this->subscribers).
           super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->subscribers).
             super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pfVar1; __x = __x + 1) {
    std::function<void_(QpModelStatus_&)>::function(&local_40,__x);
    std::function<void_(QpModelStatus_&)>::operator()(&local_40,args);
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
  }
  return;
}

Assistant:

void fire(T args) {
    for (std::function<void(T)> fun : subscribers) {
      fun(args);
    }
  }